

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void insertCell(MemPage *pPage,int i,u8 *pCell,int sz,u8 *pTemp,Pgno iChild,int *pRC)

{
  ushort *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  u8 *puVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint *__dest;
  bool bVar13;
  int rc;
  int local_64;
  u8 *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint local_3c;
  int *local_38;
  
  if ((pPage->nOverflow != '\0') || (local_3c = sz + 2, pPage->nFree < (int)local_3c)) {
    if (pTemp != (u8 *)0x0) {
      memcpy(pTemp,pCell,(long)sz);
      pCell = pTemp;
    }
    if (iChild != 0) {
      *(Pgno *)pCell =
           iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
    }
    bVar2 = pPage->nOverflow;
    pPage->nOverflow = bVar2 + 1;
    pPage->apOvfl[bVar2] = pCell;
    pPage->aiOvfl[bVar2] = (u16)i;
    return;
  }
  iVar4 = sqlite3PagerWrite(pPage->pDbPage);
  if (iVar4 != 0) {
    *pRC = iVar4;
    return;
  }
  local_60 = pPage->aData;
  uVar10 = (ulong)pPage->hdrOffset;
  local_64 = 0;
  uVar12 = (uint)pPage->cellOffset + (uint)pPage->nCell * 2;
  uVar3 = *(ushort *)(local_60 + uVar10 + 5) << 8 | *(ushort *)(local_60 + uVar10 + 5) >> 8;
  uVar11 = (uint)uVar3;
  local_38 = pRC;
  if ((uVar3 < uVar12) && ((uVar3 != 0 || (uVar11 = 0x10000, pPage->pBt->usableSize != 0x10000)))) {
    iVar4 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10beb,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    uVar8 = 0;
  }
  else {
    if (((local_60[uVar10 + 2] != '\0') || (uVar8 = 0, local_60[uVar10 + 1] != '\0')) &&
       (uVar8 = 0, uVar12 + 2 <= uVar11)) {
      local_58 = uVar10;
      local_50 = (ulong)uVar12;
      puVar6 = pageFindSlot(pPage,sz,&local_64);
      uVar12 = (uint)local_50;
      if (puVar6 == (u8 *)0x0) {
        bVar13 = local_64 == 0;
        uVar8 = 0;
        iVar4 = local_64;
      }
      else {
        uVar7 = (int)puVar6 - (int)local_60;
        if ((int)uVar12 < (int)uVar7) {
          iVar4 = 0;
          uVar8 = (ulong)uVar7;
        }
        else {
          iVar4 = 0xb;
          local_48 = (ulong)uVar7;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10bfd,
                      "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
          uVar12 = (uint)local_50;
          uVar8 = local_48;
        }
        bVar13 = false;
      }
      uVar10 = local_58;
      if (!bVar13) goto LAB_00147cc7;
    }
    if ((int)uVar11 < (int)(uVar12 + sz + 2)) {
      iVar5 = (pPage->nFree - sz) + -2;
      iVar4 = 4;
      if (iVar5 < 4) {
        iVar4 = iVar5;
      }
      local_58 = uVar10;
      iVar4 = defragmentPage(pPage,iVar4);
      local_64 = iVar4;
      if (iVar4 != 0) goto LAB_00147cc7;
      uVar11 = (((uint)local_60[local_58 + 5] * 0x100 + (uint)local_60[local_58 + 6]) - 1 & 0xffff)
               + 1;
      uVar10 = local_58;
    }
    uVar3 = (ushort)(uVar11 - sz);
    *(ushort *)(local_60 + uVar10 + 5) = uVar3 << 8 | uVar3 >> 8;
    iVar4 = 0;
    uVar8 = (ulong)(uVar11 - sz);
  }
LAB_00147cc7:
  if (iVar4 == 0) {
    pPage->nFree = pPage->nFree - (local_3c & 0xffff);
    __dest = (uint *)(local_60 + (int)uVar8);
    local_48 = uVar8;
    if (iChild == 0) {
      memcpy(__dest,pCell,(long)sz);
    }
    else {
      memcpy(__dest + 1,pCell + 4,(long)(sz + -4));
      *__dest = iChild >> 0x18 | (iChild & 0xff0000) >> 8 | (iChild & 0xff00) << 8 | iChild << 0x18;
    }
    lVar9 = (long)i;
    puVar1 = (ushort *)(pPage->aCellIdx + lVar9 * 2);
    memmove(puVar1 + 1,pPage->aCellIdx + lVar9 * 2,((ulong)pPage->nCell - lVar9) * 2);
    *puVar1 = (ushort)local_48 << 8 | (ushort)local_48 >> 8;
    pPage->nCell = pPage->nCell + 1;
    puVar6 = local_60 + (ulong)pPage->hdrOffset + 4;
    *puVar6 = *puVar6 + '\x01';
    if (*puVar6 == '\0') {
      local_60[(ulong)pPage->hdrOffset + 3] = local_60[(ulong)pPage->hdrOffset + 3] + '\x01';
    }
    if (pPage->pBt->autoVacuum != '\0') {
      ptrmapPutOvflPtr(pPage,pPage,pCell,local_38);
      return;
    }
  }
  else {
    *local_38 = iVar4;
  }
  return;
}

Assistant:

static void insertCell(
  MemPage *pPage,   /* Page into which we are copying */
  int i,            /* New cell becomes the i-th cell of the page */
  u8 *pCell,        /* Content of the new cell */
  int sz,           /* Bytes of content in pCell */
  u8 *pTemp,        /* Temp storage space for pCell, if needed */
  Pgno iChild,      /* If non-zero, replace first 4 bytes with this value */
  int *pRC          /* Read and write return code from here */
){
  int idx = 0;      /* Where to write new cell content in data[] */
  int j;            /* Loop counter */
  u8 *data;         /* The content of the whole page */
  u8 *pIns;         /* The point in pPage->aCellIdx[] where no cell inserted */

  assert( *pRC==SQLITE_OK );
  assert( i>=0 && i<=pPage->nCell+pPage->nOverflow );
  assert( MX_CELL(pPage->pBt)<=10921 );
  assert( pPage->nCell<=MX_CELL(pPage->pBt) || CORRUPT_DB );
  assert( pPage->nOverflow<=ArraySize(pPage->apOvfl) );
  assert( ArraySize(pPage->apOvfl)==ArraySize(pPage->aiOvfl) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sz==pPage->xCellSize(pPage, pCell) || CORRUPT_DB );
  assert( pPage->nFree>=0 );
  if( pPage->nOverflow || sz+2>pPage->nFree ){
    if( pTemp ){
      memcpy(pTemp, pCell, sz);
      pCell = pTemp;
    }
    if( iChild ){
      put4byte(pCell, iChild);
    }
    j = pPage->nOverflow++;
    /* Comparison against ArraySize-1 since we hold back one extra slot
    ** as a contingency.  In other words, never need more than 3 overflow
    ** slots but 4 are allocated, just to be safe. */
    assert( j < ArraySize(pPage->apOvfl)-1 );
    pPage->apOvfl[j] = pCell;
    pPage->aiOvfl[j] = (u16)i;

    /* When multiple overflows occur, they are always sequential and in
    ** sorted order.  This invariants arise because multiple overflows can
    ** only occur when inserting divider cells into the parent page during
    ** balancing, and the dividers are adjacent and sorted.
    */
    assert( j==0 || pPage->aiOvfl[j-1]<(u16)i ); /* Overflows in sorted order */
    assert( j==0 || i==pPage->aiOvfl[j-1]+1 );   /* Overflows are sequential */
  }else{
    int rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc!=SQLITE_OK ){
      *pRC = rc;
      return;
    }
    assert( sqlite3PagerIswriteable(pPage->pDbPage) );
    data = pPage->aData;
    assert( &data[pPage->cellOffset]==pPage->aCellIdx );
    rc = allocateSpace(pPage, sz, &idx);
    if( rc ){ *pRC = rc; return; }
    /* The allocateSpace() routine guarantees the following properties
    ** if it returns successfully */
    assert( idx >= 0 );
    assert( idx >= pPage->cellOffset+2*pPage->nCell+2 || CORRUPT_DB );
    assert( idx+sz <= (int)pPage->pBt->usableSize );
    pPage->nFree -= (u16)(2 + sz);
    if( iChild ){
      /* In a corrupt database where an entry in the cell index section of
      ** a btree page has a value of 3 or less, the pCell value might point
      ** as many as 4 bytes in front of the start of the aData buffer for
      ** the source page.  Make sure this does not cause problems by not
      ** reading the first 4 bytes */
      memcpy(&data[idx+4], pCell+4, sz-4);
      put4byte(&data[idx], iChild);
    }else{
      memcpy(&data[idx], pCell, sz);
    }
    pIns = pPage->aCellIdx + i*2;
    memmove(pIns+2, pIns, 2*(pPage->nCell - i));
    put2byte(pIns, idx);
    pPage->nCell++;
    /* increment the cell count */
    if( (++data[pPage->hdrOffset+4])==0 ) data[pPage->hdrOffset+3]++;
    assert( get2byte(&data[pPage->hdrOffset+3])==pPage->nCell || CORRUPT_DB );
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pPage->pBt->autoVacuum ){
      /* The cell may contain a pointer to an overflow page. If so, write
      ** the entry for the overflow page into the pointer map.
      */
      ptrmapPutOvflPtr(pPage, pPage, pCell, pRC);
    }
#endif
  }
}